

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int cssx(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
        double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
        double *var,double *loglik,double *hess,int start,int imean)

{
  size_t __size;
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  double *oup;
  ulong uVar5;
  double *oup_00;
  double *__dest;
  size_t sVar6;
  double *A;
  reg_object obj;
  double *pdVar7;
  double *pdVar8;
  xlik_css_object __ptr;
  double *pdVar9;
  double *dx;
  int *ipiv;
  int iVar10;
  void *pvVar11;
  ulong uVar12;
  int N_00;
  int iVar13;
  long lVar14;
  long lVar15;
  undefined1 local_f0 [8];
  custom_function css_min;
  void *local_c8;
  void *local_b8;
  ulong local_58;
  
  iVar13 = N - D * s;
  lVar14 = (long)iVar13;
  oup = (double *)malloc(lVar14 * 8);
  uVar5 = 0;
  if (xreg != (double *)0x0) {
    uVar5 = (ulong)(uint)r;
  }
  if (start == 0) {
    if (0 < p) {
      memset(phi,0,(ulong)(uint)p << 3);
    }
    if (0 < q) {
      memset(theta + p,0,(ulong)(uint)q << 3);
    }
    if (0 < P) {
      uVar12 = 0;
      do {
        PHI[(long)(q + p) + uVar12] = 0.0;
        uVar12 = uVar12 + 1;
      } while ((uint)P != uVar12);
    }
    if (0 < Q) {
      uVar12 = 0;
      do {
        THETA[(long)(q + p + P) + uVar12] = 0.0;
        uVar12 = uVar12 + 1;
      } while ((uint)Q != uVar12);
    }
  }
  if (D < 1) {
    local_58 = (ulong)(uint)N;
    if (0 < N) {
      memcpy(oup,inp,(ulong)(uint)N << 3);
      local_58 = (ulong)(uint)N;
    }
  }
  else {
    uVar3 = diffs(inp,N,D,s,oup);
    local_58 = (ulong)uVar3;
  }
  iVar10 = (int)local_58;
  oup_00 = (double *)malloc((long)(iVar10 - d) << 3);
  if (d < 1) {
    if (0 < iVar10) {
      memcpy(oup_00,oup,local_58 << 3);
    }
  }
  else {
    uVar3 = diff(oup,iVar10,d,oup_00);
    local_58 = (ulong)uVar3;
  }
  lVar15 = (long)N;
  __dest = (double *)malloc(lVar15 * (r + 1) * 8);
  iVar10 = -D;
  if (imean != 1 || iVar10 != d) {
    if (0 < (int)uVar5) {
      memcpy(__dest,xreg,uVar5 * lVar15 * 8);
    }
  }
  else {
    if (0 < N) {
      uVar12 = 0;
      do {
        __dest[uVar12] = 1.0;
        uVar12 = uVar12 + 1;
      } while ((uint)N != uVar12);
    }
    if (0 < r) {
      memcpy(__dest + lVar15,xreg,(ulong)(uint)r * lVar15 * 8);
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  sVar6 = (long)(int)local_58 * 8;
  A = (double *)malloc((long)(r + 1) * sVar6);
  N_00 = (int)uVar5;
  if (0 < N_00) {
    pdVar7 = A;
    pdVar8 = __dest;
    uVar12 = uVar5;
    pdVar9 = __dest;
    iVar2 = N;
    if (0 < D) {
      do {
        diffs(pdVar9,N,D,s,pdVar7);
        memcpy(pdVar8,pdVar7,lVar14 * 8);
        uVar12 = uVar12 - 1;
        pdVar7 = pdVar7 + lVar14;
        pdVar8 = pdVar8 + lVar14;
        pdVar9 = pdVar9 + lVar15;
        iVar2 = iVar13;
      } while (uVar12 != 0);
    }
    if (0 < d) {
      uVar12 = 1;
      if (1 < N_00) {
        uVar12 = uVar5;
      }
      pdVar7 = __dest;
      pdVar8 = A;
      do {
        diff(pdVar7,iVar2,d,pdVar8);
        pdVar8 = pdVar8 + (int)local_58;
        pdVar7 = pdVar7 + iVar2;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    if (iVar10 == d) {
      memcpy(A,__dest,uVar5 * sVar6);
    }
    iVar13 = rank(A,(int)local_58,N_00);
    if (iVar13 < N_00) {
      puts("Exogenous Variables are collinear. ");
      free(oup);
      free(__dest);
      free(A);
      free(oup_00);
      return 7;
    }
    obj = reg_init((int)local_58,N_00);
    __size = uVar5 * 8;
    pdVar7 = (double *)malloc(uVar5 * __size);
    pdVar8 = (double *)malloc(sVar6);
    local_b8 = malloc(__size);
    local_c8 = malloc(__size);
    lVar14 = 0;
    setIntercept(obj,0);
    regress(obj,A,oup_00,pdVar8,pdVar7,0.95);
    uVar12 = 1;
    if (1 < N_00) {
      uVar12 = uVar5;
    }
    do {
      *(undefined8 *)((long)local_b8 + lVar14) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar14 * 4);
      *(double *)((long)local_c8 + lVar14) =
           *(double *)((long)&obj->beta[0].stdErr + lVar14 * 4) * 10.0;
      lVar14 = lVar14 + 8;
    } while (uVar12 * 8 != lVar14);
    free(pdVar7);
    free(pdVar8);
    free_reg(obj);
  }
  __ptr = xlik_css_init(p,d,q,s,P,D,Q,N_00,(int)local_58);
  iVar13 = __ptr->pq;
  lVar14 = (long)iVar13;
  sVar6 = lVar14 * 8;
  pdVar7 = (double *)malloc(sVar6);
  pdVar8 = (double *)malloc(sVar6);
  pdVar9 = (double *)malloc(sVar6 * lVar14);
  dx = (double *)malloc(sVar6);
  ipiv = (int *)malloc(lVar14 * 4);
  __ptr->N = (int)local_58;
  iVar2 = __ptr->offset;
  if (0 < p) {
    memcpy(pdVar7,phi,(ulong)(uint)p * 8);
  }
  if (0 < q) {
    uVar12 = 0;
    do {
      pdVar7[(long)p + uVar12] = -theta[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)q != uVar12);
  }
  if (0 < P) {
    uVar12 = 0;
    do {
      pdVar7[(long)(p + q) + uVar12] = PHI[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)P != uVar12);
  }
  css_min.params = (void *)(ulong)(uint)Q;
  if (0 < Q) {
    pvVar11 = (void *)0x0;
    do {
      pdVar7[(long)(p + q + P) + (long)pvVar11] = -THETA[(long)pvVar11];
      pvVar11 = (void *)((long)pvVar11 + 1);
    } while (css_min.params != pvVar11);
  }
  if (N_00 < 1) {
    __ptr->mean = 0.0;
  }
  else {
    uVar12 = 0;
    do {
      pdVar7[(long)(p + q + P + Q) + uVar12] = *(double *)((long)local_b8 + uVar12 * 8);
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  if (0 < (int)local_58) {
    uVar12 = 0;
    do {
      dVar1 = oup_00[uVar12];
      __ptr->x[(long)(iVar2 + (int)local_58 * 2) + uVar12] = dVar1;
      __ptr->x[(long)iVar2 + uVar12] = dVar1;
      uVar12 = uVar12 + 1;
    } while (local_58 != uVar12);
  }
  if (SBORROW4((int)local_58,(int)local_58 * 2) != 0 < (int)local_58) {
    memset(__ptr->x + ((int)local_58 + iVar2),0,(ulong)((int)local_58 - 1) * 8 + 8);
  }
  if ((0 < N_00) && ((int)local_58 * 3 < (N_00 + 3) * (int)local_58)) {
    memcpy(__ptr->x + (iVar2 + (int)local_58 * 3),A,(ulong)((int)local_58 * N_00 - 1) * 8 + 8);
  }
  local_f0 = (undefined1  [8])fcssx;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar3 = fminunc((custom_function *)local_f0,(custom_gradient *)0x0,iVar13,pdVar7,1.0,optmethod,
                  pdVar8);
  if ((0xf < uVar3) || ((0x8011U >> (uVar3 & 0x1f) & 1) == 0)) {
    uVar3 = 1;
  }
  uVar4 = iVar13 - N_00;
  if (uVar4 != 0 && N_00 <= iVar13) {
    uVar12 = 0;
    do {
      dx[uVar12] = 1.0;
      uVar12 = uVar12 + 1;
    } while (uVar4 != uVar12);
  }
  if (0 < N_00) {
    uVar12 = 0;
    do {
      dx[(long)(int)uVar4 + uVar12] = *(double *)((long)local_c8 + uVar12 * 8);
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  hessian_fd((custom_function *)local_f0,pdVar8,iVar13,dx,__ptr->eps,hess);
  mtranspose(hess,iVar13,iVar13,pdVar9);
  if (iVar13 != 0) {
    uVar12 = 0;
    do {
      pdVar9[uVar12] = (hess[uVar12] + pdVar9[uVar12]) * (double)((int)local_58 - (D * s + d)) * 0.5
      ;
      uVar12 = uVar12 + 1;
    } while (iVar13 * iVar13 + (uint)(iVar13 * iVar13 == 0) != uVar12);
  }
  ludecomp(pdVar9,iVar13,ipiv);
  minverse(pdVar9,iVar13,ipiv,hess);
  if (0 < p) {
    memcpy(phi,pdVar8,(ulong)(uint)p << 3);
  }
  if (0 < q) {
    uVar12 = 0;
    do {
      theta[uVar12] = -pdVar8[(long)p + uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)q != uVar12);
  }
  if (0 < P) {
    uVar12 = 0;
    do {
      PHI[uVar12] = pdVar8[(long)(q + p) + uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)P != uVar12);
  }
  if (0 < Q) {
    pvVar11 = (void *)0x0;
    do {
      THETA[(long)pvVar11] = -pdVar8[(long)(q + p + P) + (long)pvVar11];
      pvVar11 = (void *)((long)pvVar11 + 1);
    } while (css_min.params != pvVar11);
  }
  if (imean != 1 || iVar10 != d) {
    *wmean = 0.0;
    if (0 < N_00) {
      uVar12 = 0;
      do {
        exog[uVar12] = pdVar8[(long)(q + p + P + Q) + uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar5 != uVar12);
    }
  }
  else {
    lVar14 = (long)(q + p + P + Q);
    *wmean = pdVar8[lVar14];
    if (1 < N_00) {
      lVar15 = 0;
      do {
        exog[lVar15] = pdVar8[lVar14 + lVar15 + 1];
        lVar15 = lVar15 + 1;
      } while (uVar5 - 1 != lVar15);
    }
  }
  *var = __ptr->ssq / (double)__ptr->Nmncond;
  *loglik = __ptr->loglik;
  free(pdVar7);
  free(pdVar8);
  free(oup);
  free(__dest);
  free(A);
  free(oup_00);
  free(pdVar9);
  free(dx);
  free(ipiv);
  if (0 < N_00) {
    free(local_b8);
    free(local_c8);
  }
  free(__ptr);
  return uVar3;
}

Assistant:

int cssx(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA,  double *exog, int r, double *wmean, double *var,double *loglik,double *hess,int start,int imean) {
	int i, pq, retval, length, offset,ret,nd,ncxreg,N1,rnk,orig,ERR;
	double *b, *tf, *x, *inp2,*dx,*thess,*x0,*XX,*U,*V,*SIG,*coeff,*sigma,*varcovar,*res;
	int *ipiv;
	double maxstep;
	xlik_css_object obj;
	reg_object fit;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	nd = d + D;
	ncxreg = (xreg == NULL) ? 0 : r;

	maxstep = 1.0;

	if (start == 0) {
		for (i = 0; i < p; ++i) {
			phi[i] = 0.0;
		}
		for (i = 0; i < q; ++i) {
			theta[p + i] = 0.0;
		}
		for (i = 0; i < P; ++i) {
			PHI[p + q + i] = 0.0;
		}
		for (i = 0; i < Q; ++i) {
			THETA[p + q + P + i] = 0.0;
		}
	}

	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);


		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
		}


		free(varcovar);
		free(res);
		free_reg(fit);
	}


	obj = xlik_css_init(p, d, q, s, P, D, Q, ncxreg, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	} else {
		obj->mean = 0.0;
	}

	

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}

	custom_function css_min = { fcssx, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}
	
	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}
	

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) obj->Nmncond;
	//*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	
	free(b);
	free(tf);
	free(inp2);
	free(x0);
	free(XX); 
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	free_xlik_css(obj);
	return ret;
}